

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::DecodeChunk
              (EXRImage *exr_image,EXRHeader *exr_header,
              vector<unsigned_long,_std::allocator<unsigned_long>_> *offsets,uchar *head,size_t size
              ,string *err)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  void *pvVar5;
  uchar **ppuVar6;
  const_reference pvVar7;
  ulong uVar8;
  int *piVar9;
  long lVar10;
  long in_RCX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  long in_RSI;
  long *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_R8;
  string *in_R9;
  int c;
  stringstream ss_5;
  tinyexr_int64 lno;
  int num_lines;
  int end_line_no;
  int data_len_1;
  int line_no;
  uchar *data_ptr_1;
  size_t data_size_1;
  size_t y_idx;
  int y;
  stringstream ss_4;
  bool total_data_len_overflown;
  size_t total_data_len;
  bool ret;
  int data_len;
  int tile_coordinates [4];
  uchar *data_ptr;
  size_t data_size;
  size_t tile_idx;
  int err_code;
  size_t num_tiles;
  stringstream ss_3;
  stringstream ss_2;
  bool invalid_data;
  size_t channel_offset;
  int pixel_data_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channel_offset_list;
  size_t num_blocks;
  stringstream ss_1;
  int threshold;
  stringstream ss;
  int data_height;
  int data_width;
  int num_scanline_blocks;
  int num_channels;
  int local_d08 [2];
  int local_d00;
  int in_stack_fffffffffffff308;
  int in_stack_fffffffffffff30c;
  int in_stack_fffffffffffff310;
  int in_stack_fffffffffffff314;
  uint in_stack_fffffffffffff318;
  undefined4 in_stack_fffffffffffff31c;
  undefined4 in_stack_fffffffffffff320;
  int in_stack_fffffffffffff324;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff328;
  size_t in_stack_fffffffffffff368;
  uchar *in_stack_fffffffffffff370;
  int *in_stack_fffffffffffff378;
  int *in_stack_fffffffffffff380;
  int *in_stack_fffffffffffff388;
  undefined7 in_stack_fffffffffffff390;
  undefined1 in_stack_fffffffffffff397;
  undefined8 in_stack_fffffffffffff3d0;
  undefined8 in_stack_fffffffffffff3d8;
  undefined8 in_stack_fffffffffffff3e0;
  undefined8 in_stack_fffffffffffff3e8;
  undefined7 in_stack_fffffffffffff430;
  undefined1 in_stack_fffffffffffff437;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar11;
  int local_b34;
  stringstream local_b30 [392];
  long local_9a8;
  int local_9a0;
  int local_99c;
  int local_998;
  int local_994;
  uint local_990;
  uint local_98c;
  uint *local_988;
  ulong local_980;
  size_type local_978;
  int local_96c;
  string local_968 [32];
  stringstream local_948 [16];
  ostream local_938 [16];
  int in_stack_fffffffffffff6d8;
  int in_stack_fffffffffffff6dc;
  size_t in_stack_fffffffffffff6e0;
  uchar *in_stack_fffffffffffff6e8;
  int *in_stack_fffffffffffff6f0;
  uchar **in_stack_fffffffffffff6f8;
  int in_stack_fffffffffffff710;
  int in_stack_fffffffffffff718;
  int in_stack_fffffffffffff720;
  int in_stack_fffffffffffff728;
  int in_stack_fffffffffffff730;
  int in_stack_fffffffffffff738;
  size_t in_stack_fffffffffffff740;
  size_t in_stack_fffffffffffff748;
  EXRAttribute *in_stack_fffffffffffff750;
  size_t in_stack_fffffffffffff758;
  EXRChannelInfo *in_stack_fffffffffffff760;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff768;
  uint local_7ac;
  undefined8 local_7a8;
  undefined8 local_7a0;
  undefined8 *local_790;
  ulong local_788;
  ulong local_780;
  int local_774;
  size_type local_770;
  string local_768 [32];
  stringstream local_748 [16];
  ostream local_738 [376];
  string local_5c0 [32];
  stringstream local_5a0 [16];
  ostream local_590 [379];
  byte local_415;
  undefined4 local_414;
  undefined8 local_410;
  int local_404;
  size_type local_3e8;
  string local_3e0 [32];
  stringstream local_3c0 [16];
  ostream local_3b0 [380];
  undefined4 local_234;
  string local_230 [48];
  stringstream local_200 [16];
  ostream local_1f0 [376];
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  string *local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_60;
  long local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_50;
  long local_48;
  long *local_40;
  int local_34;
  
  local_6c = *(int *)(in_RSI + 0x78);
  local_70 = 1;
  if (*(int *)(in_RSI + 0x7c) == 3) {
    local_70 = 0x10;
  }
  else if (*(int *)(in_RSI + 0x7c) == 4) {
    local_70 = 0x20;
  }
  else if (*(int *)(in_RSI + 0x7c) == 0x80) {
    local_70 = 0x10;
  }
  local_74 = (*(int *)(in_RSI + 0x10) - *(int *)(in_RSI + 8)) + 1;
  local_78 = (*(int *)(in_RSI + 0x14) - *(int *)(in_RSI + 0xc)) + 1;
  local_68 = in_R9;
  if ((local_74 < 0) || (local_78 < 0)) {
    if (in_R9 != (string *)0x0) {
      std::__cxx11::stringstream::stringstream(local_200);
      poVar4 = std::operator<<(local_1f0,"Invalid data width or data height: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_74);
      poVar4 = std::operator<<(poVar4,", ");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,local_78);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator+=(local_68,local_230);
      std::__cxx11::string::~string(local_230);
      std::__cxx11::stringstream::~stringstream(local_200);
    }
    return -4;
  }
  local_234 = 0x800000;
  if ((0x800000 < local_74) || (0x800000 < local_78)) {
    if (in_R9 != (string *)0x0) {
      std::__cxx11::stringstream::stringstream(local_3c0);
      poVar4 = std::operator<<(local_3b0,"data_with or data_height too large. data_width: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_74);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,"data_height = ");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,local_78);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator+=(local_68,local_3e0);
      std::__cxx11::string::~string(local_3e0);
      std::__cxx11::stringstream::~stringstream(local_3c0);
    }
    return -4;
  }
  local_60 = in_R8;
  local_58 = in_RCX;
  local_50 = in_RDX;
  local_48 = in_RSI;
  local_40 = in_RDI;
  local_3e8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDX);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x180b47);
  local_404 = 0;
  local_410 = 0;
  bVar2 = ComputeChannelLayout
                    (in_stack_fffffffffffff328,
                     (int *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                     (size_t *)CONCAT44(in_stack_fffffffffffff31c,in_stack_fffffffffffff318),
                     in_stack_fffffffffffff314,
                     (EXRChannelInfo *)CONCAT44(in_stack_fffffffffffff30c,in_stack_fffffffffffff308)
                    );
  if (!bVar2) {
    if (local_68 != (string *)0x0) {
      std::__cxx11::string::operator+=(local_68,"Failed to compute channel layout.\n");
    }
    local_34 = -4;
    goto LAB_00181b03;
  }
  local_415 = 0;
  if (*(int *)(local_48 + 0x38) == 0) {
    uVar8 = (long)local_74 * (long)local_78 * (long)local_6c;
    if ((uVar8 == 0) || (0x3fffffffff < uVar8)) {
      if (local_68 != (string *)0x0) {
        std::__cxx11::stringstream::stringstream(local_948);
        poVar4 = std::operator<<(local_938,"Image data size is zero or too large: width = ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_74);
        poVar4 = std::operator<<(poVar4,", height = ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_78);
        poVar4 = std::operator<<(poVar4,", channels = ");
        pvVar5 = (void *)std::ostream::operator<<(poVar4,local_6c);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::stringstream::str();
        std::__cxx11::string::operator+=(local_68,local_968);
        std::__cxx11::string::~string(local_968);
        std::__cxx11::stringstream::~stringstream(local_948);
      }
      local_34 = -4;
      goto LAB_00181b03;
    }
    ppuVar6 = AllocateImage(in_stack_fffffffffffff324,
                            (EXRChannelInfo *)
                            CONCAT44(in_stack_fffffffffffff31c,in_stack_fffffffffffff318),
                            (int *)CONCAT44(in_stack_fffffffffffff314,in_stack_fffffffffffff310),
                            in_stack_fffffffffffff30c,in_stack_fffffffffffff308);
    local_40[1] = (long)ppuVar6;
    for (local_96c = 0; local_96c < (int)local_3e8; local_96c = local_96c + 1) {
      local_978 = (size_type)local_96c;
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_50,local_978);
      pvVar11 = local_60;
      if (local_60 < (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(*pvVar7 + 8)) {
        local_415 = 1;
      }
      else {
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (local_50,local_978);
        lVar1 = local_58;
        local_980 = (long)pvVar11 - (*pvVar7 + 8);
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (local_50,local_978);
        local_988 = (uint *)(lVar1 + *pvVar7);
        local_98c = *local_988;
        local_990 = local_988[1];
        swap4(&local_98c);
        swap4(&local_990);
        if (local_980 < (ulong)(long)(int)local_990) {
          local_415 = 1;
        }
        else if (((int)local_98c < 0x200001) && (-0x200001 < (int)local_98c)) {
          if (local_990 == 0) {
            local_415 = 1;
          }
          else {
            local_998 = local_98c + local_70;
            local_99c = *(int *)(local_48 + 0x14) + 1;
            piVar9 = std::min<int>(&local_998,&local_99c);
            local_994 = *piVar9;
            local_9a0 = local_994 - local_98c;
            if (local_9a0 < 1) {
              local_415 = 1;
            }
            else {
              local_988 = local_988 + 2;
              lVar10 = (long)(int)local_98c - (long)*(int *)(local_48 + 0xc);
              local_9a8 = lVar10;
              iVar3 = std::numeric_limits<int>::max();
              lVar1 = local_9a8;
              if (iVar3 < lVar10) {
                local_98c = 0xffffffff;
              }
              else {
                iVar3 = std::numeric_limits<int>::max();
                if (lVar1 < -iVar3) {
                  local_98c = 0xffffffff;
                }
                else {
                  local_98c = local_98c - *(int *)(local_48 + 0xc);
                }
              }
              if ((int)local_98c < 0) {
                local_415 = 1;
              }
              else {
                local_d00 = local_78;
                local_d08[0] = local_74;
                in_stack_fffffffffffff310 = local_96c;
                bVar2 = DecodePixelData(in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0,
                                        in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0,
                                        in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8,
                                        in_stack_fffffffffffff710,in_stack_fffffffffffff718,
                                        in_stack_fffffffffffff720,in_stack_fffffffffffff728,
                                        in_stack_fffffffffffff730,in_stack_fffffffffffff738,
                                        in_stack_fffffffffffff740,in_stack_fffffffffffff748,
                                        in_stack_fffffffffffff750,in_stack_fffffffffffff758,
                                        in_stack_fffffffffffff760,in_stack_fffffffffffff768);
                if (!bVar2) {
                  local_415 = 1;
                }
              }
            }
          }
        }
        else {
          local_415 = 1;
        }
      }
    }
  }
  else {
    if (*(int *)(local_48 + 0x3c) < 0) {
      if (local_68 != (string *)0x0) {
        std::__cxx11::stringstream::stringstream(local_5a0);
        poVar4 = std::operator<<(local_590,"Invalid tile size x : ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(int *)(local_48 + 0x3c));
        std::operator<<(poVar4,"\n");
        std::__cxx11::stringstream::str();
        std::__cxx11::string::operator+=(local_68,local_5c0);
        std::__cxx11::string::~string(local_5c0);
        std::__cxx11::stringstream::~stringstream(local_5a0);
      }
      local_34 = -9;
      goto LAB_00181b03;
    }
    if (*(int *)(local_48 + 0x40) < 0) {
      if (local_68 != (string *)0x0) {
        std::__cxx11::stringstream::stringstream(local_748);
        poVar4 = std::operator<<(local_738,"Invalid tile size y : ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(int *)(local_48 + 0x40));
        std::operator<<(poVar4,"\n");
        std::__cxx11::stringstream::str();
        std::__cxx11::string::operator+=(local_68,local_768);
        std::__cxx11::string::~string(local_768);
        std::__cxx11::stringstream::~stringstream(local_748);
      }
      local_34 = -9;
      goto LAB_00181b03;
    }
    local_770 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_50);
    pvVar5 = calloc(local_770,0x20);
    *local_40 = (long)pvVar5;
    local_774 = 0;
    for (local_780 = 0; local_780 < local_770; local_780 = local_780 + 1) {
      ppuVar6 = AllocateImage(in_stack_fffffffffffff324,
                              (EXRChannelInfo *)
                              CONCAT44(in_stack_fffffffffffff31c,in_stack_fffffffffffff318),
                              (int *)CONCAT44(in_stack_fffffffffffff314,in_stack_fffffffffffff310),
                              in_stack_fffffffffffff30c,in_stack_fffffffffffff308);
      *(uchar ***)(*local_40 + local_780 * 0x20 + 0x18) = ppuVar6;
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_50,local_780);
      if (local_60 < (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(*pvVar7 + 0x14)) {
        if (local_68 != (string *)0x0) {
          std::__cxx11::string::operator+=(local_68,"Insufficient data size.\n");
        }
        local_774 = -4;
        break;
      }
      pvVar11 = local_60;
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_50,local_780);
      lVar1 = local_58;
      local_788 = (long)pvVar11 - (*pvVar7 + 0x14);
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_50,local_780);
      local_790 = (undefined8 *)(lVar1 + *pvVar7);
      local_7a8 = *local_790;
      local_7a0 = local_790[1];
      swap4((uint *)&local_7a8);
      swap4((uint *)((long)&local_7a8 + 4));
      swap4((uint *)&local_7a0);
      swap4((uint *)((long)&local_7a0 + 4));
      if ((uint)local_7a0 != 0) {
        local_774 = -10;
        break;
      }
      if (local_7a0._4_4_ != 0) {
        local_774 = -10;
        break;
      }
      local_7ac = *(uint *)(local_790 + 2);
      swap4(&local_7ac);
      if (((int)local_7ac < 4) || (local_788 < (ulong)(long)(int)local_7ac)) {
        if (local_68 != (string *)0x0) {
          std::__cxx11::string::operator+=(local_68,"Insufficient data length.\n");
        }
        local_774 = -4;
        break;
      }
      local_790 = (undefined8 *)((long)local_790 + 0x14);
      local_d08[0] = *(int *)(local_48 + 0x7c);
      local_d00 = *(int *)(local_48 + 4);
      in_stack_fffffffffffff308 = local_74;
      in_stack_fffffffffffff310 = local_78;
      in_stack_fffffffffffff318 = (uint)local_7a8;
      in_stack_fffffffffffff437 =
           DecodeTiledPixelData
                     ((uchar **)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
                      in_stack_fffffffffffff388,in_stack_fffffffffffff380,in_stack_fffffffffffff378,
                      in_stack_fffffffffffff370,in_stack_fffffffffffff368,
                      (int)in_stack_fffffffffffff3d0,(int)in_stack_fffffffffffff3d8,
                      (int)in_stack_fffffffffffff3e0,(int)in_stack_fffffffffffff3e8,(int)local_48,
                      (int)local_d08,(int)*(undefined8 *)(local_48 + 0x68),*(int *)(local_48 + 0x78)
                      ,*(size_t *)(local_48 + 0x60),(long)*(int *)(local_48 + 0x5c),
                      (EXRAttribute *)(long)local_404,*(size_t *)(local_48 + 0x80),
                      (EXRChannelInfo *)
                      CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430),pvVar11);
      if (!(bool)in_stack_fffffffffffff437) {
        if (local_68 != (string *)0x0) {
          std::__cxx11::string::operator+=(local_68,"Failed to decode tile data.\n");
        }
        local_774 = -4;
      }
      *(uint *)(*local_40 + local_780 * 0x20) = (uint)local_7a8;
      *(undefined4 *)(*local_40 + local_780 * 0x20 + 4) = local_7a8._4_4_;
      *(uint *)(*local_40 + local_780 * 0x20 + 8) = (uint)local_7a0;
      *(int *)(*local_40 + local_780 * 0x20 + 0xc) = local_7a0._4_4_;
    }
    if (local_774 != 0) {
      local_34 = local_774;
      goto LAB_00181b03;
    }
    *(int *)((long)local_40 + 0x1c) = (int)local_770;
  }
  if ((local_415 & 1) == 0) {
    for (local_b34 = 0; local_b34 < *(int *)(local_48 + 0x78); local_b34 = local_b34 + 1) {
      *(undefined4 *)(*(long *)(local_48 + 0x70) + (long)local_b34 * 4) =
           *(undefined4 *)(*(long *)(local_48 + 0x80) + (long)local_b34 * 4);
    }
    *(int *)(local_40 + 3) = local_6c;
    *(int *)(local_40 + 2) = local_74;
    *(int *)((long)local_40 + 0x14) = local_78;
    local_34 = 0;
  }
  else {
    if (local_68 != (string *)0x0) {
      std::__cxx11::stringstream::stringstream(local_b30);
      std::__cxx11::string::operator+=(local_68,"Invalid data found when decoding pixels.\n");
      std::__cxx11::stringstream::~stringstream(local_b30);
    }
    local_34 = -4;
  }
LAB_00181b03:
  local_414 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffff314,in_stack_fffffffffffff310));
  return local_34;
}

Assistant:

static int DecodeChunk(EXRImage *exr_image, const EXRHeader *exr_header,
                       const std::vector<tinyexr::tinyexr_uint64> &offsets,
                       const unsigned char *head, const size_t size,
                       std::string *err) {
  int num_channels = exr_header->num_channels;

  int num_scanline_blocks = 1;
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZIP) {
    num_scanline_blocks = 16;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
    num_scanline_blocks = 32;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
    num_scanline_blocks = 16;
  }

  int data_width = exr_header->data_window[2] - exr_header->data_window[0] + 1;
  int data_height = exr_header->data_window[3] - exr_header->data_window[1] + 1;

  if ((data_width < 0) || (data_height < 0)) {
    if (err) {
      std::stringstream ss;
      ss << "Invalid data width or data height: " << data_width << ", "
         << data_height << std::endl;
      (*err) += ss.str();
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  // Do not allow too large data_width and data_height. header invalid?
  {
    const int threshold = 1024 * 8192;  // heuristics
    if ((data_width > threshold) || (data_height > threshold)) {
      if (err) {
        std::stringstream ss;
        ss << "data_with or data_height too large. data_width: " << data_width
           << ", "
           << "data_height = " << data_height << std::endl;
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }
  }

  size_t num_blocks = offsets.size();

  std::vector<size_t> channel_offset_list;
  int pixel_data_size = 0;
  size_t channel_offset = 0;
  if (!tinyexr::ComputeChannelLayout(&channel_offset_list, &pixel_data_size,
                                     &channel_offset, num_channels,
                                     exr_header->channels)) {
    if (err) {
      (*err) += "Failed to compute channel layout.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  bool invalid_data = false;  // TODO(LTE): Use atomic lock for MT safety.

  if (exr_header->tiled) {
    // value check
    if (exr_header->tile_size_x < 0) {
      if (err) {
        std::stringstream ss;
        ss << "Invalid tile size x : " << exr_header->tile_size_x << "\n";
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_HEADER;
    }

    if (exr_header->tile_size_y < 0) {
      if (err) {
        std::stringstream ss;
        ss << "Invalid tile size y : " << exr_header->tile_size_y << "\n";
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_HEADER;
    }

    size_t num_tiles = offsets.size();  // = # of blocks

    exr_image->tiles = static_cast<EXRTile *>(
        calloc(static_cast<size_t>(num_tiles), sizeof(EXRTile)));

    int err_code = TINYEXR_SUCCESS;

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)

    std::vector<std::thread> workers;
    std::atomic<size_t> tile_count(0);

    int num_threads = std::max(1, int(std::thread::hardware_concurrency()));
    if (num_threads > int(num_tiles)) {
      num_threads = int(num_tiles);
    }

    for (int t = 0; t < num_threads; t++) {
      workers.emplace_back(std::thread([&]() {
        size_t tile_idx = 0;
        while ((tile_idx = tile_count++) < num_tiles) {

#else
    for (size_t tile_idx = 0; tile_idx < num_tiles; tile_idx++) {
#endif
          // Allocate memory for each tile.
          exr_image->tiles[tile_idx].images = tinyexr::AllocateImage(
              num_channels, exr_header->channels,
              exr_header->requested_pixel_types, exr_header->tile_size_x,
              exr_header->tile_size_y);

          // 16 byte: tile coordinates
          // 4 byte : data size
          // ~      : data(uncompressed or compressed)
          if (offsets[tile_idx] + sizeof(int) * 5 > size) {
            // TODO(LTE): atomic
            if (err) {
              (*err) += "Insufficient data size.\n";
            }
            err_code = TINYEXR_ERROR_INVALID_DATA;
            break;
          }

          size_t data_size =
              size_t(size - (offsets[tile_idx] + sizeof(int) * 5));
          const unsigned char *data_ptr =
              reinterpret_cast<const unsigned char *>(head + offsets[tile_idx]);

          int tile_coordinates[4];
          memcpy(tile_coordinates, data_ptr, sizeof(int) * 4);
          tinyexr::swap4(
              reinterpret_cast<unsigned int *>(&tile_coordinates[0]));
          tinyexr::swap4(
              reinterpret_cast<unsigned int *>(&tile_coordinates[1]));
          tinyexr::swap4(
              reinterpret_cast<unsigned int *>(&tile_coordinates[2]));
          tinyexr::swap4(
              reinterpret_cast<unsigned int *>(&tile_coordinates[3]));

          // @todo{ LoD }
          if (tile_coordinates[2] != 0) {
            err_code = TINYEXR_ERROR_UNSUPPORTED_FEATURE;
            break;
          }
          if (tile_coordinates[3] != 0) {
            err_code = TINYEXR_ERROR_UNSUPPORTED_FEATURE;
            break;
          }

          int data_len;
          memcpy(&data_len, data_ptr + 16,
                 sizeof(int));  // 16 = sizeof(tile_coordinates)
          tinyexr::swap4(reinterpret_cast<unsigned int *>(&data_len));

          if (data_len < 4 || size_t(data_len) > data_size) {
            // TODO(LTE): atomic
            if (err) {
              (*err) += "Insufficient data length.\n";
            }
            err_code = TINYEXR_ERROR_INVALID_DATA;
            break;
          }

          // Move to data addr: 20 = 16 + 4;
          data_ptr += 20;

          bool ret = tinyexr::DecodeTiledPixelData(
              exr_image->tiles[tile_idx].images,
              &(exr_image->tiles[tile_idx].width),
              &(exr_image->tiles[tile_idx].height),
              exr_header->requested_pixel_types, data_ptr,
              static_cast<size_t>(data_len), exr_header->compression_type,
              exr_header->line_order, data_width, data_height,
              tile_coordinates[0], tile_coordinates[1], exr_header->tile_size_x,
              exr_header->tile_size_y, static_cast<size_t>(pixel_data_size),
              static_cast<size_t>(exr_header->num_custom_attributes),
              exr_header->custom_attributes,
              static_cast<size_t>(exr_header->num_channels),
              exr_header->channels, channel_offset_list);

          if (!ret) {
            // TODO(LTE): atomic
            if (err) {
              (*err) += "Failed to decode tile data.\n";
            }
            err_code = TINYEXR_ERROR_INVALID_DATA;
          }

          exr_image->tiles[tile_idx].offset_x = tile_coordinates[0];
          exr_image->tiles[tile_idx].offset_y = tile_coordinates[1];
          exr_image->tiles[tile_idx].level_x = tile_coordinates[2];
          exr_image->tiles[tile_idx].level_y = tile_coordinates[3];

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)
        }
      }));
    }  // num_thread loop

    for (auto &t : workers) {
      t.join();
    }

#else
    }
#endif

    if (err_code != TINYEXR_SUCCESS) {
      return err_code;
    }

    exr_image->num_tiles = static_cast<int>(num_tiles);
  } else {  // scanline format

    // Don't allow too large image(256GB * pixel_data_size or more). Workaround
    // for #104.
    size_t total_data_len =
        size_t(data_width) * size_t(data_height) * size_t(num_channels);
    const bool total_data_len_overflown =
        sizeof(void *) == 8 ? (total_data_len >= 0x4000000000) : false;
    if ((total_data_len == 0) || total_data_len_overflown) {
      if (err) {
        std::stringstream ss;
        ss << "Image data size is zero or too large: width = " << data_width
           << ", height = " << data_height << ", channels = " << num_channels
           << std::endl;
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    exr_image->images = tinyexr::AllocateImage(
        num_channels, exr_header->channels, exr_header->requested_pixel_types,
        data_width, data_height);

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)
    std::vector<std::thread> workers;
    std::atomic<int> y_count(0);

    int num_threads = std::max(1, int(std::thread::hardware_concurrency()));
    if (num_threads > int(num_blocks)) {
      num_threads = int(num_blocks);
    }

    for (int t = 0; t < num_threads; t++) {
      workers.emplace_back(std::thread([&]() {
        int y = 0;
        while ((y = y_count++) < int(num_blocks)) {

#else

#if TINYEXR_USE_OPENMP
#pragma omp parallel for
#endif
    for (int y = 0; y < static_cast<int>(num_blocks); y++) {

#endif
          size_t y_idx = static_cast<size_t>(y);

          if (offsets[y_idx] + sizeof(int) * 2 > size) {
            invalid_data = true;
          } else {
            // 4 byte: scan line
            // 4 byte: data size
            // ~     : pixel data(uncompressed or compressed)
            size_t data_size =
                size_t(size - (offsets[y_idx] + sizeof(int) * 2));
            const unsigned char *data_ptr =
                reinterpret_cast<const unsigned char *>(head + offsets[y_idx]);

            int line_no;
            memcpy(&line_no, data_ptr, sizeof(int));
            int data_len;
            memcpy(&data_len, data_ptr + 4, sizeof(int));
            tinyexr::swap4(reinterpret_cast<unsigned int *>(&line_no));
            tinyexr::swap4(reinterpret_cast<unsigned int *>(&data_len));

            if (size_t(data_len) > data_size) {
              invalid_data = true;

            } else if ((line_no > (2 << 20)) || (line_no < -(2 << 20))) {
              // Too large value. Assume this is invalid
              // 2**20 = 1048576 = heuristic value.
              invalid_data = true;
            } else if (data_len == 0) {
              // TODO(syoyo): May be ok to raise the threshold for example
              // `data_len < 4`
              invalid_data = true;
            } else {
              // line_no may be negative.
              int end_line_no = (std::min)(line_no + num_scanline_blocks,
                                           (exr_header->data_window[3] + 1));

              int num_lines = end_line_no - line_no;

              if (num_lines <= 0) {
                invalid_data = true;
              } else {
                // Move to data addr: 8 = 4 + 4;
                data_ptr += 8;

                // Adjust line_no with data_window.bmin.y

                // overflow check
                tinyexr_int64 lno =
                    static_cast<tinyexr_int64>(line_no) -
                    static_cast<tinyexr_int64>(exr_header->data_window[1]);
                if (lno > std::numeric_limits<int>::max()) {
                  line_no = -1;  // invalid
                } else if (lno < -std::numeric_limits<int>::max()) {
                  line_no = -1;  // invalid
                } else {
                  line_no -= exr_header->data_window[1];
                }

                if (line_no < 0) {
                  invalid_data = true;
                } else {
                  if (!tinyexr::DecodePixelData(
                          exr_image->images, exr_header->requested_pixel_types,
                          data_ptr, static_cast<size_t>(data_len),
                          exr_header->compression_type, exr_header->line_order,
                          data_width, data_height, data_width, y, line_no,
                          num_lines, static_cast<size_t>(pixel_data_size),
                          static_cast<size_t>(
                              exr_header->num_custom_attributes),
                          exr_header->custom_attributes,
                          static_cast<size_t>(exr_header->num_channels),
                          exr_header->channels, channel_offset_list)) {
                    invalid_data = true;
                  }
                }
              }
            }
          }

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)
        }
      }));
    }

    for (auto &t : workers) {
      t.join();
    }
#else
    }  // omp parallel
#endif
  }

  if (invalid_data) {
    if (err) {
      std::stringstream ss;
      (*err) += "Invalid data found when decoding pixels.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  // Overwrite `pixel_type` with `requested_pixel_type`.
  {
    for (int c = 0; c < exr_header->num_channels; c++) {
      exr_header->pixel_types[c] = exr_header->requested_pixel_types[c];
    }
  }

  {
    exr_image->num_channels = num_channels;

    exr_image->width = data_width;
    exr_image->height = data_height;
  }

  return TINYEXR_SUCCESS;
}